

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest02ValidityPeriods_::
Section2InvalidEEnotAfterDateTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section2InvalidEEnotAfterDateTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.2.6";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b2d90,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b63a0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest02ValidityPeriods,
                     Section2InvalidEEnotAfterDateTest6) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "InvalidEEnotAfterDateTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.2.6";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}